

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_CCtx_setFParams(ZSTD_CCtx *cctx,ZSTD_frameParameters fparams)

{
  uint uVar1;
  ZSTD_CCtx *cctx_00;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  undefined8 in_stack_ffffffffffffffc0;
  ZSTD_CCtx *in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  cctx_00 = (ZSTD_CCtx *)
            ZSTD_CCtx_setParameter
                      (in_stack_ffffffffffffffc8,
                       (ZSTD_cParameter)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                       (int)in_stack_ffffffffffffffc0);
  uVar1 = ERR_isError((size_t)cctx_00);
  local_8 = cctx_00;
  if (uVar1 == 0) {
    local_8 = (ZSTD_CCtx *)
              ZSTD_CCtx_setParameter
                        (cctx_00,(ZSTD_cParameter)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                         (int)in_stack_ffffffffffffffc0);
    uVar1 = ERR_isError((size_t)local_8);
    if (uVar1 == 0) {
      local_8 = (ZSTD_CCtx *)
                ZSTD_CCtx_setParameter
                          (cctx_00,(ZSTD_cParameter)((ulong)local_8 >> 0x20),(int)local_8);
      uVar1 = ERR_isError((size_t)local_8);
      if (uVar1 == 0) {
        local_8 = (ZSTD_CCtx *)0x0;
      }
    }
  }
  return (size_t)local_8;
}

Assistant:

size_t ZSTD_CCtx_setFParams(ZSTD_CCtx* cctx, ZSTD_frameParameters fparams)
{
    ZSTD_STATIC_ASSERT(sizeof(fparams) == 3 * 4 /* all params are listed below */);
    DEBUGLOG(4, "ZSTD_CCtx_setFParams");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_contentSizeFlag, fparams.contentSizeFlag != 0), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_checksumFlag, fparams.checksumFlag != 0), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_dictIDFlag, fparams.noDictIDFlag == 0), "");
    return 0;
}